

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

Integer pnga_pgroup_split(Integer grp,Integer grp_num)

{
  void *__ptr;
  Integer *list;
  Integer IVar1;
  Integer IVar2;
  long count;
  long lVar3;
  long in_RSI;
  Integer in_RDI;
  Integer ret;
  Integer grp_id;
  Integer *nodes;
  Integer icnt;
  Integer i;
  Integer grp_size;
  Integer end;
  Integer start;
  Integer ratio;
  Integer default_grp;
  Integer me;
  Integer nprocs;
  Integer in_stack_00000118;
  char *in_stack_00000120;
  Integer in_stack_ffffffffffffff80;
  long grp_00;
  Integer local_78;
  long local_60;
  long local_58;
  long local_50;
  Integer local_8;
  
  local_78 = -1;
  __ptr = malloc(GAnproc << 3);
  if (in_RSI < 0) {
    pnga_error(in_stack_00000120,in_stack_00000118);
  }
  local_8 = in_RDI;
  if (in_RSI != 0) {
    list = (Integer *)pnga_pgroup_get_default();
    pnga_pgroup_set_default(in_stack_ffffffffffffff80);
    IVar1 = pnga_nnodes();
    IVar2 = pnga_nodeid();
    local_50 = IVar1 / in_RSI;
    if (local_50 * in_RSI < IVar1) {
      local_50 = local_50 + 1;
    }
    count = IVar2 / local_50;
    lVar3 = (count + 1) * local_50 + -1;
    if (IVar1 + -1 < lVar3) {
      lVar3 = IVar1 + -1;
    }
    grp_00 = lVar3;
    if (lVar3 < count * local_50) {
      pnga_error(in_stack_00000120,in_stack_00000118);
    }
    local_60 = 0;
    for (local_58 = 0; local_58 < IVar1; local_58 = local_58 + 1) {
      if ((local_60 % local_50 == 0) && (0 < local_58)) {
        IVar2 = pnga_pgroup_create(list,count);
        if (local_58 == lVar3 + 1) {
          local_78 = IVar2;
        }
        local_60 = 0;
      }
      *(long *)((long)__ptr + local_60 * 8) = local_58;
      local_60 = local_60 + 1;
    }
    IVar2 = pnga_pgroup_create(list,count);
    if (lVar3 == IVar1 + -1) {
      local_78 = IVar2;
    }
    pnga_pgroup_set_default(grp_00);
    if (local_78 == -1) {
      pnga_error(in_stack_00000120,in_stack_00000118);
    }
    free(__ptr);
    local_8 = local_78;
  }
  return local_8;
}

Assistant:

Integer pnga_pgroup_split(Integer grp, Integer grp_num)
{
  Integer nprocs, me, default_grp;
  Integer ratio, start, end, grp_size;
  Integer i, icnt;
  Integer *nodes;
  Integer grp_id, ret=-1;

  /* Allocate temporary array */
  nodes = (Integer*)malloc(GAnproc*sizeof(Integer));

  if(grp_num<0) pnga_error("Invalid argument (number of groups < 0)",grp_num);
  if(grp_num==0) return grp;
  
  default_grp = pnga_pgroup_get_default();
  pnga_pgroup_set_default(grp);
  
#if 0 /* This is wrong. Should split only default group and not world group */
  world_grp = pnga_pgroup_get_world();
  pnga_pgroup_set_default(world_grp);
#endif
  nprocs = pnga_nnodes();
  me = pnga_nodeid();
  /* Figure out how big groups are */
  grp_size = nprocs/grp_num;
  if (nprocs > grp_size*grp_num) grp_size++;
  /* Figure out what procs are in my group */
  ratio = me/grp_size;
  start = ratio*grp_size;
  end = (ratio+1)*grp_size-1;
  end = GA_MIN(end,nprocs-1);
  if (end<start)
    pnga_error("Invalid proc range encountered",0);
  icnt = 0;
  for (i= 0; i<nprocs; i++) {
    if (icnt%grp_size == 0 && i>0) {
      grp_id = pnga_pgroup_create(nodes, grp_size);
      if (i == end + 1) {
        ret = grp_id;
      }
      icnt = 0;
    }
    nodes[icnt] = i;
    icnt++;
  }
  grp_id = pnga_pgroup_create(nodes, icnt);
  if (end == nprocs-1) {
    ret = grp_id;
  }
  pnga_pgroup_set_default(default_grp);
  if(ret==-1) pnga_error("ga_pgroup_split failed",ret);
  /* Free temporary array */
  free(nodes);
  return ret;
}